

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O2

bool __thiscall xray_re::xr_ini_file::load(xr_ini_file *this,char *path)

{
  char *p;
  bool bVar1;
  xr_file_system *this_00;
  xr_reader *this_01;
  size_t sVar2;
  
  this_00 = xr_file_system::instance();
  this_01 = xr_file_system::r_open(this_00,path);
  if (this_01 != (xr_reader *)0x0) {
    p = (this_01->field_2).m_p_s8;
    sVar2 = xr_reader::size(this_01);
    bVar1 = parse(this,p,p + sVar2,path);
    (*this_01->_vptr_xr_reader[1])(this_01);
    if (bVar1) {
      return true;
    }
    trim_container<std::vector<xray_re::xr_ini_file::ini_section*,std::allocator<xray_re::xr_ini_file::ini_section*>>>
              (&this->m_sections);
  }
  return false;
}

Assistant:

bool xr_ini_file::load(const char* path)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(path);
	if (r == 0)
		return false;
	const char* p = r->pointer<const char>();
	bool status = parse(p, p + r->size(), path);
	fs.r_close(r);
	if (status)
		return true;
	clear();
	return false;
}